

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(void)

{
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  value_type *pvVar3;
  int local_1c;
  int local_18;
  int i_2;
  int i_1;
  int i;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->IO).Fonts != (ImFontAtlas *)0x0) {
    ImFontAtlas::Clear((GImGui->IO).Fonts);
  }
  if ((pIVar1->Initialized & 1U) != 0) {
    SaveIniSettingsToDisk((pIVar1->IO).IniFilename);
    for (i_2 = 0; i_2 < (pIVar1->Windows).Size; i_2 = i_2 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i_2);
      ImGuiWindow::~ImGuiWindow(*ppIVar2);
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i_2);
      MemFree(*ppIVar2);
    }
    ImVector<ImGuiWindow_*>::clear(&pIVar1->Windows);
    ImVector<ImGuiWindow_*>::clear(&pIVar1->WindowsSortBuffer);
    pIVar1->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear(&pIVar1->CurrentWindowStack);
    pIVar1->NavWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar1->MovedWindow = (ImGuiWindow *)0x0;
    for (local_18 = 0; local_18 < (pIVar1->Settings).Size; local_18 = local_18 + 1) {
      pvVar3 = ImVector<ImGuiIniData>::operator[](&pIVar1->Settings,local_18);
      MemFree(pvVar3->Name);
    }
    ImVector<ImGuiIniData>::clear(&pIVar1->Settings);
    ImVector<ImGuiColMod>::clear(&pIVar1->ColorModifiers);
    ImVector<ImGuiStyleMod>::clear(&pIVar1->StyleModifiers);
    ImVector<ImFont_*>::clear(&pIVar1->FontStack);
    ImVector<ImGuiPopupRef>::clear(&pIVar1->OpenPopupStack);
    ImVector<ImGuiPopupRef>::clear(&pIVar1->CurrentPopupStack);
    pIVar1->SetNextWindowSizeConstraintCallback = (ImGuiSizeConstraintCallback)0x0;
    pIVar1->SetNextWindowSizeConstraintCallbackUserData = (void *)0x0;
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      ImVector<ImDrawList_*>::clear(pIVar1->RenderDrawLists + local_1c);
    }
    ImDrawList::ClearFreeMemory(&pIVar1->OverlayDrawList);
    ImVector<char>::clear(&pIVar1->PrivateClipboard);
    ImVector<unsigned_short>::clear(&(pIVar1->InputTextState).Text);
    ImVector<char>::clear(&(pIVar1->InputTextState).InitialText);
    ImVector<char>::clear(&(pIVar1->InputTextState).TempTextBuffer);
    if ((pIVar1->LogFile != (FILE *)0x0) && (pIVar1->LogFile != _stdout)) {
      fclose((FILE *)pIVar1->LogFile);
      pIVar1->LogFile = (FILE *)0x0;
    }
    if (pIVar1->LogClipboard != (ImGuiTextBuffer *)0x0) {
      ImGuiTextBuffer::~ImGuiTextBuffer(pIVar1->LogClipboard);
      MemFree(pIVar1->LogClipboard);
    }
    pIVar1->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown()
{
    ImGuiContext& g = *GImGui;

    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    if (g.IO.Fonts) // Testing for NULL to allow user to NULLify in case of running Shutdown() on multiple contexts. Bit hacky.
        g.IO.Fonts->Clear();

    // Cleanup of other data are conditional on actually having initialize ImGui.
    if (!g.Initialized)
        return;

    SaveIniSettingsToDisk(g.IO.IniFilename);

    for (int i = 0; i < g.Windows.Size; i++)
    {
        g.Windows[i]->~ImGuiWindow();
        ImGui::MemFree(g.Windows[i]);
    }
    g.Windows.clear();
    g.WindowsSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.NavWindow = NULL;
    g.HoveredWindow = NULL;
    g.HoveredRootWindow = NULL;
    g.ActiveIdWindow = NULL;
    g.MovedWindow = NULL;
    for (int i = 0; i < g.Settings.Size; i++)
        ImGui::MemFree(g.Settings[i].Name);
    g.Settings.clear();
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.CurrentPopupStack.clear();
    g.SetNextWindowSizeConstraintCallback = NULL;
    g.SetNextWindowSizeConstraintCallbackUserData = NULL;
    for (int i = 0; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
        g.RenderDrawLists[i].clear();
    g.OverlayDrawList.ClearFreeMemory();
    g.PrivateClipboard.clear();
    g.InputTextState.Text.clear();
    g.InputTextState.InitialText.clear();
    g.InputTextState.TempTextBuffer.clear();

    if (g.LogFile && g.LogFile != stdout)
    {
        fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard)
    {
        g.LogClipboard->~ImGuiTextBuffer();
        ImGui::MemFree(g.LogClipboard);
    }

    g.Initialized = false;
}